

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IEnumerableCore.hpp
# Opt level: O0

void __thiscall
linq::
IEnumerableCore<linq::WhereState<linq::IEnumerable<int>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/farnyser[P]linq-cpp/tests/tests.cpp:49:44),_int>_>
::iterator::iterator
          (iterator *this,
          WhereState<linq::IEnumerable<int>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_farnyser[P]linq_cpp_tests_tests_cpp:49:44),_int>
          *src,bool v)

{
  bool bVar1;
  bool v_local;
  WhereState<linq::IEnumerable<int>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_farnyser[P]linq_cpp_tests_tests_cpp:49:44),_int>
  *src_local;
  iterator *this_local;
  
  WhereState<linq::IEnumerable<int>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/farnyser[P]linq-cpp/tests/tests.cpp:49:44),_int>
  ::WhereState(&this->source,src);
  this->valid = false;
  this->valid = v;
  if (v) {
    WhereState<linq::IEnumerable<int>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/farnyser[P]linq-cpp/tests/tests.cpp:49:44),_int>
    ::Init(&this->source);
    bVar1 = WhereState<linq::IEnumerable<int>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/farnyser[P]linq-cpp/tests/tests.cpp:49:44),_int>
            ::Valid(&this->source);
    this->valid = bVar1;
  }
  return;
}

Assistant:

iterator(S src, bool v = true) : source(src) {
				valid = v;
				
				if(v) { 
					source.Init();	
					valid = source.Valid();
				}
			}